

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O2

ByteData * __thiscall
cfd::api::HDWalletApi::ConvertMnemonicToSeed
          (ByteData *__return_storage_ptr__,HDWalletApi *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *passphrase,bool strict_check,string *language,bool use_ideographic_space
          ,ByteData *entropy)

{
  bool bVar1;
  CfdException *pCVar2;
  undefined3 in_register_00000081;
  HDWallet wallet;
  allocator local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  if (CONCAT31(in_register_00000081,strict_check) != 0) {
    if (language->_M_string_length == 0) {
      wallet.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdapi_hdwallet.cpp";
      wallet.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x3d;
      wallet.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "ConvertMnemonicToSeed";
      core::logger::warn<>
                ((CfdSourceLocation *)&wallet,
                 "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need to set language."
                );
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&wallet,
                 "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need to set language."
                 ,local_88);
      core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&wallet);
      __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    bVar1 = core::HDWallet::CheckValidMnemonic(mnemonic,language);
    if (!bVar1) {
      wallet.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdapi_hdwallet.cpp";
      wallet.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x48;
      wallet.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "ConvertMnemonicToSeed";
      core::logger::warn<>
                ((CfdSourceLocation *)&wallet,
                 "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&wallet,"Failed to ConvertMnemonicToSeed. Mnemonic strict check error.",
                 local_88);
      core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&wallet);
      __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  if ((entropy != (ByteData *)0x0) && (language->_M_string_length != 0)) {
    core::HDWallet::ConvertMnemonicToEntropy(&wallet.seed_,mnemonic,language);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)entropy,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wallet);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wallet);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,mnemonic);
  std::__cxx11::string::string((string *)&local_50,(string *)passphrase);
  core::HDWallet::HDWallet(&wallet,&local_68,&local_50,use_ideographic_space);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  core::HDWallet::GetSeed(__return_storage_ptr__,&wallet);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wallet);
  return __return_storage_ptr__;
}

Assistant:

ByteData HDWalletApi::ConvertMnemonicToSeed(
    const std::vector<std::string>& mnemonic, const std::string& passphrase,
    bool strict_check, const std::string& language, bool use_ideographic_space,
    ByteData* entropy) const {
  if (strict_check) {
    if (language.empty()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need "
          "to set language.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need "
          "to set language.");
    }

    if (!HDWallet::CheckValidMnemonic(mnemonic, language)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
    }
  }

  try {
    // calculate entropy
    if (!language.empty() && entropy != nullptr) {
      *entropy = HDWallet::ConvertMnemonicToEntropy(mnemonic, language);
    }

    // calculate seed
    HDWallet wallet(mnemonic, passphrase, use_ideographic_space);
    return wallet.GetSeed();
  } catch (CfdException& e) {
    warn(
        CFD_LOG_SOURCE, "Failed to ConvertMnemonicToSeed. error: [{}]",
        e.what());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to ConvertMnemonicToSeed. " + std::string(e.what()));
  }
}